

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void filter_8x1_pixels(__m256i *sig,__m256i *fil,__m256i *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar7 [16];
  __m256i rounding;
  __m256i max;
  __m256i min;
  __m256i a1;
  __m256i a0;
  __m256i a;
  undefined8 uStack_230;
  undefined8 uStack_228;
  
  auVar3 = vpmaddwd_avx2(*in_RSI,*in_RDI);
  auVar4 = vpmaddwd_avx2(in_RSI[3],in_RDI[3]);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar4 = vpmaddwd_avx2(in_RSI[1],in_RDI[1]);
  auVar5 = vpmaddwd_avx2(in_RSI[2],in_RDI[2]);
  auVar6 = vpminsd_avx2(auVar4,auVar5);
  auVar3 = vpaddd_avx2(auVar3,auVar6);
  auVar4 = vpmaxsd_avx2(auVar4,auVar5);
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar1 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar1 = vpinsrd_avx(auVar1,0x40,2);
  auVar1 = vpinsrd_avx(auVar1,0x40,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar2 = vpinsrd_avx(auVar2,0x40,2);
  auVar2 = vpinsrd_avx(auVar2,0x40,3);
  auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_230 = auVar7._0_8_;
  uStack_228 = auVar7._8_8_;
  auVar4._16_8_ = uStack_230;
  auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar4._24_8_ = uStack_228;
  auVar3 = vpaddd_avx2(auVar3,auVar4);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416(7));
  *in_RDX = auVar3;
  return;
}

Assistant:

static inline void filter_8x1_pixels(const __m256i *sig /*sig[4]*/,
                                     const __m256i *fil /*fil[4]*/,
                                     __m256i *y) {
  __m256i a, a0, a1;

  a0 = _mm256_madd_epi16(fil[0], sig[0]);
  a1 = _mm256_madd_epi16(fil[3], sig[3]);
  a = _mm256_add_epi32(a0, a1);

  a0 = _mm256_madd_epi16(fil[1], sig[1]);
  a1 = _mm256_madd_epi16(fil[2], sig[2]);

  {
    const __m256i min = _mm256_min_epi32(a0, a1);
    a = _mm256_add_epi32(a, min);
  }
  {
    const __m256i max = _mm256_max_epi32(a0, a1);
    a = _mm256_add_epi32(a, max);
  }
  {
    const __m256i rounding = _mm256_set1_epi32(1 << (CONV8_ROUNDING_BITS - 1));
    a = _mm256_add_epi32(a, rounding);
    *y = _mm256_srai_epi32(a, CONV8_ROUNDING_BITS);
  }
}